

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::iterate
          (ConcurrentImageAtomicCase *this)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  GLint GVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ObjectTraits *traits;
  void *pvVar11;
  ulong uVar12;
  TestError *pTVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  int invalidOperationNdx;
  Buffer resultBuffer;
  deUint32 errorExpected;
  deUint32 errorDelta;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainDelta;
  vector<int,_std::allocator<int>_> deltas;
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  int local_20c;
  ulong local_208;
  ObjectWrapper local_200;
  deUint32 local_1e8;
  deUint32 local_1e4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  vector<int,_std::allocator<int>_> local_1c8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  Functions *pFVar10;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar10 = (Functions *)CONCAT44(extraout_var,iVar6);
  uVar16 = this->m_numCalls;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  generateShuffledRamp(uVar16,&local_1c8);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Clearing image contents",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  (*pFVar10->useProgram)((this->m_imageClearProgram->m_program).m_program);
  (*pFVar10->bindImageTexture)(2,this->m_imageID,0,'\0',0,0x88b9,0x8236);
  (*pFVar10->dispatchCompute)(this->m_workSize,this->m_workSize,1);
  (*pFVar10->memoryBarrier)(0x20);
  GVar7 = (*pFVar10->getError)();
  glu::checkError(GVar7,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xaae);
  GVar8 = (*pFVar10->getUniformLocation)((this->m_program->m_program).m_program,"u_atomicDelta");
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Running shader ",0xf);
  std::ostream::operator<<((ostringstream *)local_1a8,this->m_numCalls);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," times.\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Num groups = (",0xe);
  std::ostream::operator<<((ostringstream *)local_1a8,this->m_workSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
  std::ostream::operator<<((ostringstream *)local_1a8,this->m_workSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", 1)\n",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Setting u_atomicDelta to a unique value for each call.\n",0x37);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (GVar8 == -1) {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])(local_1a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"u_atomicDelta location was -1","");
    tcu::TestError::TestError(pTVar13,(string *)local_1b0);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pFVar10->useProgram)((this->m_program->m_program).m_program);
  (*pFVar10->bindImageTexture)(2,this->m_imageID,0,'\0',0,0x88ba,0x8236);
  local_208 = (ulong)uVar16;
  if (0 < this->m_numCalls) {
    lVar18 = 0;
    do {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Call ",5);
      std::ostream::operator<<((ostringstream *)local_1a8,(int)lVar18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,": u_atomicDelta = ",0x12);
      std::ostream::operator<<
                ((ostringstream *)local_1a8,
                 local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar18]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      (*pFVar10->uniform1ui)
                (GVar8,local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar18]);
      (*pFVar10->bindBufferBase)
                (0x90d2,1,(this->m_intermediateResultBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar18]);
      (*pFVar10->dispatchCompute)(this->m_workSize,this->m_workSize,1);
      lVar18 = lVar18 + 1;
    } while (lVar18 < this->m_numCalls);
  }
  GVar7 = (*pFVar10->getError)();
  uVar17 = local_208;
  glu::checkError(GVar7,"post dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xace);
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Verifying work image, it should be filled with value ",0x35);
  uVar16 = (((int)uVar17 + 1) * (int)uVar17) / 2;
  local_208 = (ulong)uVar16;
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar18 = CONCAT44(extraout_var_00,iVar6);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_200,(Functions *)CONCAT44(extraout_var_01,iVar6),traits);
  local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b0,
             (long)(this->m_workSize * this->m_workSize),(value_type_conflict4 *)&local_1e0,
             (allocator_type *)&local_20c);
  (**(code **)(lVar18 + 0x40))(0x90d2,local_200.m_object);
  (**(code **)(lVar18 + 0x150))
            (0x90d2,(long)(this->m_workSize * this->m_workSize * 4),local_1b0,0x88ea);
  (**(code **)(lVar18 + 0xdb8))(0x20);
  (**(code **)(lVar18 + 0x1680))((this->m_imageReadProgram->m_program).m_program);
  (**(code **)(lVar18 + 0x48))(0x90d2,1,local_200.m_object);
  (**(code **)(lVar18 + 0x80))(2,this->m_imageID,0,0,0,35000,0x8236);
  (**(code **)(lVar18 + 0x528))(this->m_workSize,this->m_workSize,1);
  dVar9 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar9,"read",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xb40);
  if (local_1b0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity - (long)local_1b0);
  }
  pvVar11 = (void *)(**(code **)(lVar18 + 0xd00))
                              (0x90d2,0,(long)(this->m_workSize * this->m_workSize * 4),1);
  dVar9 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar9,"map",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xb46);
  if (pvVar11 == (void *)0x0) {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])(local_1a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"mapBufferRange returned NULL","");
    tcu::TestError::TestError(pTVar13,(string *)local_1b0);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_228,(long)(this->m_workSize * this->m_workSize));
  memcpy(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,pvVar11,
         (long)this->m_workSize * (long)this->m_workSize * 4);
  cVar4 = (**(code **)(lVar18 + 0x1670))(0x90d2);
  if (cVar4 == '\0') {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])(local_1a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"unmapBuffer returned false","");
    tcu::TestError::TestError(pTVar13,(string *)local_1b0);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_200);
  iVar6 = this->m_workSize * this->m_workSize;
  bVar5 = 0 < iVar6;
  if (0 < iVar6) {
    uVar17 = 0;
    do {
      if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar17] != uVar16) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Work image error, at index (",0x1c);
        uVar16 = (int)uVar17 >> 0x1f;
        std::ostream::operator<<
                  ((ostringstream *)local_1a8,
                   (int)((long)((ulong)uVar16 << 0x20 | uVar17 & 0xffffffff) %
                        (long)this->m_workSize));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        std::ostream::operator<<
                  ((ostringstream *)local_1a8,
                   (int)((long)((ulong)uVar16 << 0x20 | uVar17 & 0xffffffff) /
                        (long)this->m_workSize));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,") expected value ",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", got ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Work image contains invalid values.",0x23);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image contents invalid");
        if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_228.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_228.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_01500374;
      }
      uVar17 = uVar17 + 1;
    } while (iVar6 != (int)uVar17);
    bVar5 = false;
  }
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Work image contents are valid.",0x1e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (!bVar5) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&local_200,(long)this->m_numCalls,(allocator_type *)local_1b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_228,(long)this->m_numCalls,(allocator_type *)local_1b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1e0,(long)this->m_numCalls,(allocator_type *)local_1b0);
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Verifying intermediate results. ",0x20);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (0 < this->m_numCalls) {
      lVar19 = 0;
      lVar18 = 0;
      do {
        (*pFVar10->bindBuffer)
                  (0x90d2,(this->m_intermediateResultBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar18]);
        readBuffer(pFVar10,0x90d2,this->m_workSize * this->m_workSize,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&(local_200.m_gl)->activeShaderProgram + lVar19));
        lVar18 = lVar18 + 1;
        lVar19 = lVar19 + 0x18;
      } while (lVar18 < this->m_numCalls);
    }
    bVar5 = 0 < this->m_workSize;
    if (0 < this->m_workSize) {
      uVar17 = 0;
      do {
        puVar2 = local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar3 = local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < this->m_numCalls) {
          lVar18 = 0;
          pFVar10 = local_200.m_gl;
          do {
            local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar18] =
                 *(uint *)(pFVar10->activeShaderProgram + uVar17 * 4);
            lVar18 = lVar18 + 1;
            pFVar10 = (Functions *)&pFVar10->beginConditionalRender;
          } while (lVar18 < this->m_numCalls);
        }
        if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar12 = (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          lVar18 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar3,puVar2);
        }
        puVar3 = local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar12 = (ulong)(uint)this->m_numCalls;
        if (0 < this->m_numCalls) {
          uVar15 = 0;
          do {
            uVar1 = uVar15 + 1;
            uVar14 = uVar16;
            if (uVar1 != (uVar12 & 0xffffffff)) {
              uVar14 = local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar15 + 1];
            }
            *(uint *)(CONCAT44(local_1e0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_1e0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar15 * 4) =
                 uVar14 - local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar15];
            uVar12 = (ulong)this->m_numCalls;
            uVar15 = uVar1;
          } while ((long)uVar1 < (long)uVar12);
        }
        puVar2 = (pointer)CONCAT44(local_1e0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_1e0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_);
        if (puVar2 != local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          uVar12 = (long)local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
          lVar18 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar2,local_1e0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar2,puVar3);
        }
        bVar5 = validateSortedAtomicRampAdditionValueChain
                          (&local_228,uVar16,&local_20c,&local_1e4,&local_1e8);
        if (!bVar5) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Intermediate buffer error, at index (",0x25);
          uVar14 = (int)uVar17 >> 0x1f;
          std::ostream::operator<<
                    ((ostringstream *)local_1a8,
                     (int)((long)((ulong)uVar14 << 0x20 | uVar17 & 0xffffffff) %
                          (long)this->m_workSize));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          std::ostream::operator<<
                    ((ostringstream *)local_1a8,
                     (int)((long)((ulong)uVar14 << 0x20 | uVar17 & 0xffffffff) /
                          (long)this->m_workSize));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"), applied operation index ",0x1b);
          std::ostream::operator<<((ostringstream *)local_1a8,local_20c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,", value was increased by ",0x19);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,", but expected ",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "Intermediate buffer contains invalid values. Values at index (",0x3e);
          std::ostream::operator<<
                    ((ostringstream *)local_1a8,
                     (int)((long)((ulong)uVar14 << 0x20 | uVar17 & 0xffffffff) %
                          (long)this->m_workSize));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          std::ostream::operator<<
                    ((ostringstream *)local_1a8,
                     (int)((long)((ulong)uVar14 << 0x20 | uVar17 & 0xffffffff) /
                          (long)this->m_workSize));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")\n",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          if (0 < this->m_numCalls) {
            lVar18 = 0;
            do {
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Value[",6);
              std::ostream::operator<<((ostringstream *)local_1a8,(int)lVar18);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"] = ",4);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              lVar18 = lVar18 + 1;
            } while (lVar18 < this->m_numCalls);
          }
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Result = ",9);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Buffer contents invalid");
          if (!bVar5) {
            pvVar11 = (void *)CONCAT44(local_1e0.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_1e0.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_);
            if (pvVar11 != (void *)0x0) {
              operator_delete(pvVar11,(long)local_1e0.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pvVar11);
            }
            if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_228.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_228.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_228.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)&local_200);
            goto LAB_01500374;
          }
        }
        uVar17 = uVar17 + 1;
        bVar5 = (long)uVar17 < (long)this->m_workSize;
      } while ((long)uVar17 < (long)this->m_workSize);
    }
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Intermediate buffers are valid.",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pvVar11 = (void *)CONCAT44(local_1e0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_1e0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar11 != (void *)0x0) {
      operator_delete(pvVar11,(long)local_1e0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pvVar11);
    }
    if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_228.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_228.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&local_200);
    if (!bVar5) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
LAB_01500374:
  if (local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

TestCase::IterateResult ConcurrentImageAtomicCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const deUint32			sumValue		= (deUint32)(m_numCalls * (m_numCalls + 1) / 2);
	std::vector<int>		deltas;

	// generate unique deltas
	generateShuffledRamp(m_numCalls, deltas);

	// clear image
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Clearing image contents" << tcu::TestLog::EndMessage;

		gl.useProgram(m_imageClearProgram->getProgram());
		gl.bindImageTexture(2, m_imageID, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		gl.dispatchCompute(m_workSize, m_workSize, 1);
		gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");
	}

	// invoke program N times, each with a different delta
	{
		const int deltaLocation = gl.getUniformLocation(m_program->getProgram(), "u_atomicDelta");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Running shader " << m_numCalls << " times.\n"
			<< "Num groups = (" << m_workSize << ", " << m_workSize << ", 1)\n"
			<< "Setting u_atomicDelta to a unique value for each call.\n"
			<< tcu::TestLog::EndMessage;

		if (deltaLocation == -1)
			throw tcu::TestError("u_atomicDelta location was -1");

		gl.useProgram(m_program->getProgram());
		gl.bindImageTexture(2, m_imageID, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Call " << callNdx << ": u_atomicDelta = " << deltas[callNdx]
				<< tcu::TestLog::EndMessage;

			gl.uniform1ui(deltaLocation, deltas[callNdx]);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_intermediateResultBuffers[callNdx]);
			gl.dispatchCompute(m_workSize, m_workSize, 1);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "post dispatch");
	}

	// Verify result
	{
		std::vector<deUint32> result;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying work image, it should be filled with value " << sumValue << tcu::TestLog::EndMessage;

		readWorkImage(result);

		for (int ndx = 0; ndx < m_workSize * m_workSize; ++ndx)
		{
			if (result[ndx] != sumValue)
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Work image error, at index (" << ndx % m_workSize << ", " << ndx / m_workSize << ") expected value " << (sumValue) << ", got " << result[ndx] << "\n"
					<< "Work image contains invalid values."
					<< tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Work image contents are valid." << tcu::TestLog::EndMessage;
	}

	// verify steps
	{
		std::vector<std::vector<deUint32> >	intermediateResults	(m_numCalls);
		std::vector<deUint32>				valueChain			(m_numCalls);
		std::vector<deUint32>				chainDelta			(m_numCalls);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying intermediate results. " << tcu::TestLog::EndMessage;

		// collect results

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_intermediateResultBuffers[callNdx]);
			readBuffer(gl, GL_SHADER_STORAGE_BUFFER, m_workSize * m_workSize, intermediateResults[callNdx]);
		}

		// verify values

		for (int valueNdx = 0; valueNdx < m_workSize; ++valueNdx)
		{
			int			invalidOperationNdx;
			deUint32	errorDelta;
			deUint32	errorExpected;

			// collect result chain for each element
			for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
				valueChain[callNdx] = intermediateResults[callNdx][valueNdx];

			// check there exists a path from 0 to sumValue using each addition once
			// decompose cumulative results to addition operations (all additions positive => this works)

			std::sort(valueChain.begin(), valueChain.end());

			for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
				chainDelta[callNdx] = ((callNdx + 1 == m_numCalls) ? (sumValue) : (valueChain[callNdx+1])) - valueChain[callNdx];

			// chainDelta contains now the actual additions applied to the value
			std::sort(chainDelta.begin(), chainDelta.end());

			// validate chain
			if (!validateSortedAtomicRampAdditionValueChain(valueChain, sumValue, invalidOperationNdx, errorDelta, errorExpected))
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Intermediate buffer error, at index (" << valueNdx % m_workSize << ", " << valueNdx / m_workSize << "), applied operation index "
					<< invalidOperationNdx << ", value was increased by " << errorDelta << ", but expected " << errorExpected << ".\n"
					<< "Intermediate buffer contains invalid values. Values at index (" << valueNdx % m_workSize << ", " << valueNdx / m_workSize << ")\n"
					<< tcu::TestLog::EndMessage;

				for (int logCallNdx = 0; logCallNdx < m_numCalls; ++logCallNdx)
					m_testCtx.getLog() << tcu::TestLog::Message << "Value[" << logCallNdx << "] = " << intermediateResults[logCallNdx][valueNdx] << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Message << "Result = " << sumValue << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Intermediate buffers are valid." << tcu::TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}